

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

void __thiscall
Js::ParseableFunctionInfo::ForEachNestedFunc<ByteCodeGenerator::EmitOneFunction(ParseNodeFnc*)::__4>
          (ParseableFunctionInfo *this,anon_class_8_1_3e9b088b fn)

{
  bool bVar1;
  NestedArray *pNVar2;
  FunctionInfo *this_00;
  FunctionProxy *nestedFunc;
  uint local_24;
  uint i;
  NestedArray *nestedArray;
  ParseableFunctionInfo *this_local;
  anon_class_8_1_3e9b088b fn_local;
  
  this_local = (ParseableFunctionInfo *)fn.byteCodeFunction;
  pNVar2 = GetNestedArray(this);
  if (pNVar2 != (NestedArray *)0x0) {
    for (local_24 = 0; local_24 < pNVar2->nestedCount; local_24 = local_24 + 1) {
      this_00 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->
                          ((WriteBarrierPtr<Js::FunctionInfo> *)(pNVar2 + (ulong)local_24 + 1));
      nestedFunc = FunctionInfo::GetFunctionProxy(this_00);
      bVar1 = ByteCodeGenerator::EmitOneFunction::anon_class_8_1_3e9b088b::operator()
                        ((anon_class_8_1_3e9b088b *)&this_local,nestedFunc,local_24);
      if (!bVar1) {
        return;
      }
    }
  }
  return;
}

Assistant:

void ForEachNestedFunc(Fn fn)
        {
            NestedArray* nestedArray = GetNestedArray();
            if (nestedArray != nullptr)
            {
                for (uint i = 0; i < nestedArray->nestedCount; i++)
                {
                    if (!fn(nestedArray->functionInfoArray[i]->GetFunctionProxy(), i))
                    {
                        break;
                    }
                }
            }
        }